

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall
kratos::SequentialStmtBlock::add_condition
          (SequentialStmtBlock *this,
          pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *condition)

{
  pointer *ppEVar1;
  EventEdgeType EVar2;
  pointer pEVar3;
  element_type *peVar4;
  iterator __position;
  pointer pEVar5;
  pointer pEVar6;
  long lVar7;
  EventControl local_30;
  
  pEVar6 = (this->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar3 = (this->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)pEVar3 - (long)pEVar6 >> 7;
  pEVar5 = pEVar6;
  if (0 < lVar7) {
    peVar4 = (condition->second).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pEVar5 = (pointer)((long)&pEVar6->delay + ((long)pEVar3 - (long)pEVar6 & 0xffffffffffffff80U));
    EVar2 = condition->first;
    lVar7 = lVar7 + 1;
    pEVar6 = pEVar6 + 2;
    do {
      if ((pEVar6[-2].var == peVar4) && (pEVar6[-2].edge == EVar2)) {
        pEVar6 = pEVar6 + -2;
        goto LAB_001d48ac;
      }
      if ((pEVar6[-1].var == peVar4) && (pEVar6[-1].edge == EVar2)) {
        pEVar6 = pEVar6 + -1;
        goto LAB_001d48ac;
      }
      if ((pEVar6->var == peVar4) && (pEVar6->edge == EVar2)) goto LAB_001d48ac;
      if ((pEVar6[1].var == peVar4) && (pEVar6[1].edge == EVar2)) {
        pEVar6 = pEVar6 + 1;
        goto LAB_001d48ac;
      }
      lVar7 = lVar7 + -1;
      pEVar6 = pEVar6 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pEVar3 - (long)pEVar5 >> 5;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pEVar6 = pEVar3;
      if ((lVar7 != 3) ||
         ((pEVar5->var ==
           (condition->second).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr &&
          (pEVar6 = pEVar5, pEVar5->edge == condition->first)))) goto LAB_001d48ac;
      pEVar5 = pEVar5 + 1;
    }
    if ((pEVar5->var ==
         (condition->second).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr) &&
       (pEVar6 = pEVar5, pEVar5->edge == condition->first)) goto LAB_001d48ac;
    pEVar5 = pEVar5 + 1;
  }
  pEVar6 = pEVar3;
  if ((pEVar5->var ==
       (condition->second).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr) &&
     (pEVar6 = pEVar5, pEVar5->edge != condition->first)) {
    pEVar6 = pEVar3;
  }
LAB_001d48ac:
  if (pEVar6 == pEVar3) {
    EventControl::EventControl
              (&local_30,condition->first,
               (condition->second).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    __position._M_current =
         (this->conditions_).
         super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->conditions_).
        super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::
      _M_realloc_insert<kratos::EventControl>(&this->conditions_,__position,&local_30);
    }
    else {
      (__position._M_current)->type = local_30.type;
      (__position._M_current)->edge = local_30.edge;
      (__position._M_current)->delay_side = local_30.delay_side;
      *(undefined4 *)&(__position._M_current)->field_0x1c = local_30._28_4_;
      (__position._M_current)->delay = local_30.delay;
      (__position._M_current)->var = local_30.var;
      ppEVar1 = &(this->conditions_).
                 super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
  }
  return;
}

Assistant:

void SequentialStmtBlock::add_condition(
    const std::pair<EventEdgeType, std::shared_ptr<Var>> &condition) {
    // notice that the condition variable cannot be used as a condition
    // for now we only allow Port (clk and reset) type to use as conditions
    // make sure no duplicate
    auto pos = std::find_if(
        conditions_.begin(), conditions_.end(), [&condition](const EventControl &event) -> bool {
            return event.var == condition.second.get() && event.edge == condition.first;
        });
    if (pos != conditions_.end()) return;

    conditions_.emplace_back(EventControl(condition.first, *condition.second));
}